

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

int luaH_getn(Table *t)

{
  TValue *pTVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong key;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = t->sizearray;
  key = (ulong)uVar5;
  if ((uVar5 == 0) || (t->array[uVar5 - 1].tt_ != 0)) {
    if (t->node != &dummynode_) {
      uVar5 = uVar5 + 1;
      while( true ) {
        pTVar1 = luaH_getint(t,(ulong)uVar5);
        uVar3 = (ulong)uVar5;
        if (pTVar1->tt_ == 0) break;
        if (0x3fffffff < uVar5) {
          iVar4 = -1;
          do {
            pTVar1 = luaH_getint(t,(ulong)(iVar4 + 2));
            iVar4 = iVar4 + 1;
          } while (pTVar1->tt_ != 0);
          return iVar4;
        }
        key = (ulong)uVar5;
        uVar5 = uVar5 * 2;
      }
      while( true ) {
        uVar6 = key;
        uVar5 = (uint)uVar6;
        if ((int)uVar3 - uVar5 < 2) break;
        key = (ulong)(uVar5 + (int)uVar3 >> 1);
        pTVar1 = luaH_getint(t,key);
        if (pTVar1->tt_ == 0) {
          uVar3 = key;
          key = uVar6;
        }
      }
    }
  }
  else {
    uVar2 = 0;
    while (uVar5 = uVar2, 1 < (int)key - uVar5) {
      uVar2 = uVar5 + (int)key >> 1;
      if (t->array[uVar2 - 1].tt_ == 0) {
        key = (ulong)uVar2;
        uVar2 = uVar5;
      }
    }
  }
  return uVar5;
}

Assistant:

int luaH_getn (Table *t) {
  unsigned int j = t->sizearray;
  if (j > 0 && ttisnil(&t->array[j - 1])) {
    /* there is a boundary in the array part: (binary) search for it */
    unsigned int i = 0;
    while (j - i > 1) {
      unsigned int m = (i+j)/2;
      if (ttisnil(&t->array[m - 1])) j = m;
      else i = m;
    }
    return i;
  }
  /* else must find a boundary in hash part */
  else if (isdummy(t->node))  /* hash part is empty? */
    return j;  /* that is easy... */
  else return unbound_search(t, j);
}